

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhMapWriteRecord(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)

{
  sxu16 *psVar1;
  ulong uVar2;
  uchar *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  unqlite_page *puVar7;
  unqlite_page *pPage;
  unqlite_page *pOld;
  unqlite_page *local_30;
  unqlite_page *local_28;
  
  local_30 = (unqlite_page *)0x0;
  if (pEngine->iPageSize + -0x10 < (int)(uint)(pEngine->sPageMap).iPtr) {
    iVar4 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,(pEngine->sPageMap).iNum,&local_28);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = lhAcquirePage(pEngine,&local_30);
    puVar7 = local_30;
    if (iVar4 != 0) {
      return iVar4;
    }
    (pEngine->sPageMap).iNext = 0;
    (pEngine->sPageMap).iNum = local_30->iPage;
    (pEngine->sPageMap).nRec = 0;
    (pEngine->sPageMap).iPtr = 0xc;
    iVar4 = (*pEngine->pIo->xWrite)(local_28);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (local_28->iPage == pEngine->pHeader->iPage) {
      uVar2 = puVar7->iPage;
      *(ulong *)((long)local_28->zData + 0x20) =
           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
    else {
      uVar2 = puVar7->iPage;
      *(ulong *)local_28->zData =
           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
      (*pEngine->pIo->xPageUnref)(local_28);
    }
    iVar4 = (*pEngine->pIo->xWrite)(puVar7);
    if (iVar4 != 0) {
      return iVar4;
    }
    puVar3 = puVar7->zData;
    puVar3[0] = '\0';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    puVar3[4] = '\0';
    puVar3[5] = '\0';
    puVar3[6] = '\0';
    puVar3[7] = '\0';
  }
  else {
    iVar4 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,(pEngine->sPageMap).iNum,&local_30);
    puVar7 = local_30;
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  iVar4 = (*pEngine->pIo->xWrite)(puVar7);
  if (iVar4 == 0) {
    *(pgno *)(local_30->zData + (pEngine->sPageMap).iPtr) =
         iLogic >> 0x38 | (iLogic & 0xff000000000000) >> 0x28 | (iLogic & 0xff0000000000) >> 0x18 |
         (iLogic & 0xff00000000) >> 8 | (iLogic & 0xff000000) << 8 | (iLogic & 0xff0000) << 0x18 |
         (iLogic & 0xff00) << 0x28 | iLogic << 0x38;
    uVar5 = *(int *)&(pEngine->sPageMap).iPtr + 8;
    (pEngine->sPageMap).iPtr = (sxu16)uVar5;
    *(pgno *)(local_30->zData + (uVar5 & 0xffff)) =
         iReal >> 0x38 | (iReal & 0xff000000000000) >> 0x28 | (iReal & 0xff0000000000) >> 0x18 |
         (iReal & 0xff00000000) >> 8 | (iReal & 0xff000000) << 8 | (iReal & 0xff0000) << 0x18 |
         (iReal & 0xff00) << 0x28 | iReal << 0x38;
    psVar1 = &(pEngine->sPageMap).iPtr;
    *psVar1 = *psVar1 + 8;
    iVar6 = lhMapInstallBucket(pEngine,iLogic,iReal);
    iVar4 = -1;
    if (iVar6 == 0) {
      uVar5 = (pEngine->sPageMap).nRec + 1;
      (pEngine->sPageMap).nRec = uVar5;
      if (local_30->iPage == pEngine->pHeader->iPage) {
        *(uint *)(local_30->zData + 0x28) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
      }
      else {
        iVar4 = (*pEngine->pIo->xWrite)(local_30);
        if (iVar4 != 0) {
          return iVar4;
        }
        uVar5 = (pEngine->sPageMap).nRec;
        *(uint *)(local_30->zData + 8) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int lhMapWriteRecord(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)
{
	lhash_bmap_page *pMap = &pEngine->sPageMap;
	unqlite_page *pPage = 0;
	int rc;
	if( pMap->iPtr > (pEngine->iPageSize - 16) /* 8 byte logical bucket number + 8 byte real bucket number */ ){
		unqlite_page *pOld;
		/* Point to the old page */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pMap->iNum,&pOld);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Acquire a new page */
		rc = lhAcquirePage(pEngine,&pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Reflect the change  */
		pMap->iNext = 0;
		pMap->iNum = pPage->iPage;
		pMap->nRec = 0;
		pMap->iPtr = 8/* Next page number */+4/* Total records in the map*/;
		/* Link this page */
		rc = pEngine->pIo->xWrite(pOld);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		if( pOld->iPage == pEngine->pHeader->iPage ){
			/* First page (Hash header) */
			SyBigEndianPack64(&pOld->zData[4/*magic*/+4/*hash*/+8/* Free page */+8/*current split bucket*/+8/*Maximum split bucket*/],pPage->iPage);
		}else{
			/* Link the new page */
			SyBigEndianPack64(pOld->zData,pPage->iPage);
			/* Unref */
			pEngine->pIo->xPageUnref(pOld);
		}
		/* Assume the last bucket map page */
		rc = pEngine->pIo->xWrite(pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		SyBigEndianPack64(pPage->zData,0); /* Next bucket map page on the list */
	}
	if( pPage == 0){
		/* Point to the current map page */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pMap->iNum,&pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	/* Make page writable */
	rc = pEngine->pIo->xWrite(pPage);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Write the data */
	SyBigEndianPack64(&pPage->zData[pMap->iPtr],iLogic);
	pMap->iPtr += 8;
	SyBigEndianPack64(&pPage->zData[pMap->iPtr],iReal);
	pMap->iPtr += 8;
	/* Install the bucket map */
	rc = lhMapInstallBucket(pEngine,iLogic,iReal);
	if( rc == UNQLITE_OK ){
		/* Total number of records */
		pMap->nRec++;
		if( pPage->iPage == pEngine->pHeader->iPage ){
			/* Page one: Always writable */
			SyBigEndianPack32(
				&pPage->zData[4/*magic*/+4/*hash*/+8/* Free page */+8/*current split bucket*/+8/*Maximum split bucket*/+8/*Next map page*/],
				pMap->nRec);
		}else{
			/* Make page writable */
			rc = pEngine->pIo->xWrite(pPage);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			SyBigEndianPack32(&pPage->zData[8],pMap->nRec);
		}
	}
	return rc;
}